

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall gl4cts::GLSL420Pack::BindingImagesTest::releaseResource(BindingImagesTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  Utils::texture::release(&this->m_goku_texture);
  Utils::texture::release(&this->m_vegeta_texture);
  Utils::texture::release(&this->m_trunks_texture);
  if (this->m_test_case != TEX_BUFFER) {
    if ((this->m_goku_buffer).m_id != 0) {
      iVar1 = (*((this->m_goku_buffer).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_goku_buffer);
      (this->m_goku_buffer).m_id = 0;
    }
    if ((this->m_vegeta_buffer).m_id != 0) {
      iVar1 = (*((this->m_vegeta_buffer).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_vegeta_buffer);
      (this->m_vegeta_buffer).m_id = 0;
    }
    if ((this->m_trunks_buffer).m_id != 0) {
      iVar1 = (*((this->m_trunks_buffer).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x438))(1,&this->m_trunks_buffer);
      (this->m_trunks_buffer).m_id = 0;
    }
  }
  return;
}

Assistant:

void BindingImagesTest::releaseResource()
{
	m_goku_texture.release();
	m_vegeta_texture.release();
	m_trunks_texture.release();
	if (m_test_case != Utils::TEX_BUFFER)
	{
		m_goku_buffer.release();
		m_vegeta_buffer.release();
		m_trunks_buffer.release();
	}
}